

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O3

void FIX::double_conversion::TrimAndCut
               (Vector<const_char> buffer,int exponent,char *buffer_copy_space,int space_size,
               Vector<const_char> *trimmed,int *updated_exponent)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  undefined4 in_register_00000084;
  int iVar8;
  Vector<const_char> VVar9;
  Vector<const_char> local_38;
  
  pcVar7 = buffer.start_;
  plVar1 = (long *)CONCAT44(in_register_00000084,space_size);
  local_38.length_ = buffer.length_;
  if (0 < local_38.length_) {
    uVar6 = 0;
    do {
      if (pcVar7[uVar6] != '0') {
        local_38.start_ = pcVar7;
        VVar9 = Vector<const_char>::SubVector(&local_38,(int)uVar6,local_38.length_);
        uVar4 = VVar9.length_;
        pcVar7 = VVar9.start_;
        goto LAB_001674e4;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)local_38.length_ != uVar6);
  }
  uVar4 = 0;
LAB_001674e4:
  uVar6 = (ulong)uVar4;
  iVar5 = uVar4 + 1;
  do {
    if ((int)uVar6 < 1) {
      iVar8 = uVar4 + exponent;
      iVar5 = 0;
      goto LAB_00167569;
    }
    iVar5 = iVar5 + -1;
    lVar2 = uVar6 - 1;
    uVar6 = uVar6 - 1;
  } while (pcVar7[lVar2] == '0');
  local_38.start_ = pcVar7;
  local_38.length_ = uVar4;
  VVar9 = Vector<const_char>::SubVector(&local_38,0,iVar5);
  iVar5 = VVar9.length_;
  pcVar7 = VVar9.start_;
  iVar8 = (uVar4 - iVar5) + exponent;
  if (iVar5 < 0x30d) {
LAB_00167569:
    *plVar1 = (long)pcVar7;
    *(int *)(plVar1 + 1) = iVar5;
    *(int *)&trimmed->start_ = iVar8;
  }
  else {
    uVar6 = VVar9._8_8_ & 0xffffffff;
    uVar3 = 0;
    do {
      if (uVar6 == uVar3) {
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xca,
                      "T &FIX::double_conversion::Vector<const char>::operator[](int) const [T = const char]"
                     );
      }
      buffer_copy_space[uVar3] = pcVar7[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x30b);
    if (pcVar7[uVar6 - 1] == '0') {
      __assert_fail("buffer[buffer.length() - 1] != \'0\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/strtod.cc"
                    ,0x78,
                    "void FIX::double_conversion::CutToMaxSignificantDigits(Vector<const char>, int, char *, int *)"
                   );
    }
    buffer_copy_space[0x30b] = '1';
    *(int *)&trimmed->start_ = iVar5 + iVar8 + -0x30c;
    *plVar1 = (long)buffer_copy_space;
    *(undefined4 *)(plVar1 + 1) = 0x30c;
  }
  return;
}

Assistant:

static void TrimAndCut(Vector<const char> buffer, int exponent,
                       char* buffer_copy_space, int space_size,
                       Vector<const char>* trimmed, int* updated_exponent) {
  Vector<const char> left_trimmed = TrimLeadingZeros(buffer);
  Vector<const char> right_trimmed = TrimTrailingZeros(left_trimmed);
  exponent += left_trimmed.length() - right_trimmed.length();
  if (right_trimmed.length() > kMaxSignificantDecimalDigits) {
    (void) space_size;  // Mark variable as used.
    ASSERT(space_size >= kMaxSignificantDecimalDigits);
    CutToMaxSignificantDigits(right_trimmed, exponent,
                              buffer_copy_space, updated_exponent);
    *trimmed = Vector<const char>(buffer_copy_space,
                                 kMaxSignificantDecimalDigits);
  } else {
    *trimmed = right_trimmed;
    *updated_exponent = exponent;
  }
}